

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O1

char * Cba_ObjGetName(Cba_Ntk_t *p,int i)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  Vec_Str_t *p_00;
  byte *pbVar4;
  byte bVar5;
  
  if (i < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                  ,0xf1,"char *Cba_ObjNameStr(Cba_Ntk_t *, int)");
  }
  if ((p->vObjName).nSize < 1) {
LAB_003ee33e:
    __assert_fail("Cba_NtkHasObjNames(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                  ,0xf0,"int Cba_ObjName(Cba_Ntk_t *, int)");
  }
  iVar2 = Vec_IntGetEntry(&p->vObjName,i);
  pcVar3 = Abc_NamStr(p->pDesign->pStrs,iVar2);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    if ((p->vObjName).nSize < 1) goto LAB_003ee33e;
    iVar2 = Vec_IntGetEntry(&p->vObjName,i);
    cVar1 = *pcVar3;
    if (cVar1 != '\\') {
      if (cVar1 == '\0') {
        __assert_fail("pName != NULL && *pName != \'\\0\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaWriteVer.c"
                      ,0x15d,"int Cba_NameIsLegalInVerilog(char *, int)");
      }
      if ((iVar2 < 0xd) ||
         (((byte)(cVar1 + 0x85U) < 0xe6 && (cVar1 != '_' && 0x19 < (byte)(cVar1 + 0xbfU))))) {
LAB_003ee2ac:
        p_00 = Abc_NamBuffer(p->pDesign->pStrs);
        pcVar3 = Vec_StrPrintF(p_00,"\\%s ",pcVar3);
        return pcVar3;
      }
      bVar5 = pcVar3[1];
      if (bVar5 != 0) {
        pbVar4 = (byte *)(pcVar3 + 2);
        do {
          if (((((byte)(bVar5 - 0x3a) < 0xf6) && ((byte)((bVar5 & 0xdf) + 0xa5) < 0xe6)) &&
              (bVar5 != 0x5f)) && (bVar5 != 0x24)) goto LAB_003ee2ac;
          bVar5 = *pbVar4;
          pbVar4 = pbVar4 + 1;
        } while (bVar5 != 0);
      }
    }
  }
  return pcVar3;
}

Assistant:

char * Cba_ObjGetName( Cba_Ntk_t * p, int i )
{
    char * pName = Cba_ObjNameStr(p, i);
    if ( pName == NULL )
        return pName;
    if ( Cba_NameIsLegalInVerilog(pName, Cba_ObjName(p, i)) )
        return pName;
    return Vec_StrPrintF( Abc_NamBuffer(Cba_NtkNam(p)), "\\%s ", pName );
}